

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O0

value_type * __thiscall
toml::
result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
::unwrap(result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
         *this,source_location loc)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  value_type *pvVar2;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  *in_RDI;
  source_location *in_stack_00000148;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffa4;
  
  bVar1 = is_err(in_RDI);
  if (!bVar1) {
    pvVar2 = success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
             ::get(&(in_RDI->field_1).succ_);
    return pvVar2;
  }
  uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffffa0);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x28);
  cxx::to_string_abi_cxx11_(in_stack_00000148);
  std::operator+(&in_RDI->is_ok_,__rhs);
  bad_result_access::bad_result_access
            ((bad_result_access *)CONCAT44(in_stack_ffffffffffffffa4,uVar3),(string *)in_RDI);
  __cxa_throw(__rhs,&bad_result_access::typeinfo,bad_result_access::~bad_result_access);
}

Assistant:

value_type& unwrap(cxx::source_location loc = cxx::source_location::current())
    {
        if(this->is_err())
        {
            throw bad_result_access("toml::result: bad unwrap" + cxx::to_string(loc));
        }
        return this->succ_.get();
    }